

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_visitor.hpp
# Opt level: O2

LogicalType * __thiscall
duckdb::TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
          (LogicalType *__return_storage_ptr__,TypeVisitor *this,LogicalType *type,
          anon_class_1_0_00000001 *func)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *__x;
  LogicalType *pLVar1;
  idx_t index;
  uint *func_00;
  LogicalType *extraout_RDX;
  LogicalType *extraout_RDX_00;
  LogicalType *type_00;
  LogicalType *type_01;
  LogicalType *ty;
  LogicalType *type_02;
  LogicalType *ty_00;
  LogicalType *extraout_RDX_01;
  LogicalType *extraout_RDX_02;
  LogicalType *type_03;
  LogicalType *ty_01;
  LogicalType *ty_02;
  LogicalType *ty_03;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  LogicalType value;
  child_list_t<LogicalType> children;
  LogicalType local_d0;
  LogicalType local_b8;
  LogicalType local_a0;
  optional_idx local_88;
  LogicalType local_80;
  LogicalType local_68;
  child_list_t<LogicalType> local_50;
  child_list_t<LogicalType> local_38;
  
  func_00 = &switchD_01ea8d91::switchdataD_02106e6c;
  switch(*this) {
  case (TypeVisitor)0x64:
    __x = &StructType::GetChildTypes_abi_cxx11_((LogicalType *)this)->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_b8,__x);
    pLVar1 = extraout_RDX;
    for (; (element_type *)local_b8._0_8_ !=
           local_b8.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_b8._0_8_ = local_b8._0_8_ + 0x38) {
      paVar2 = &(((element_type *)local_b8._0_8_)->alias).field_2;
      VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                (&local_d0,(TypeVisitor *)paVar2->_M_local_buf,pLVar1,
                 (anon_class_1_0_00000001 *)func_00);
      LogicalType::operator=((LogicalType *)paVar2,&local_d0);
      LogicalType::~LogicalType(&local_d0);
      pLVar1 = extraout_RDX_00;
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_38,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_b8);
    LogicalType::STRUCT(&local_d0,&local_38);
    ParquetWriteSelect::anon_class_1_0_00000001::operator()
              (__return_storage_ptr__,(anon_class_1_0_00000001 *)&local_d0,ty_02);
    LogicalType::~LogicalType(&local_d0);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_38;
    goto LAB_01ea9022;
  case (TypeVisitor)0x65:
    pLVar1 = ListType::GetChildType((LogicalType *)this);
    LogicalType::LogicalType(&local_b8,pLVar1);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
              (&local_a0,(TypeVisitor *)&local_b8,type_02,(anon_class_1_0_00000001 *)func_00);
    LogicalType::LIST(&local_d0,&local_a0);
    ParquetWriteSelect::anon_class_1_0_00000001::operator()
              (__return_storage_ptr__,(anon_class_1_0_00000001 *)&local_d0,ty_00);
    break;
  case (TypeVisitor)0x66:
    pLVar1 = MapType::KeyType((LogicalType *)this);
    LogicalType::LogicalType(&local_b8,pLVar1);
    pLVar1 = MapType::ValueType((LogicalType *)this);
    LogicalType::LogicalType(&local_d0,pLVar1);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
              (&local_68,(TypeVisitor *)&local_b8,type_00,(anon_class_1_0_00000001 *)func_00);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
              (&local_80,(TypeVisitor *)&local_d0,type_01,(anon_class_1_0_00000001 *)func_00);
    LogicalType::MAP(&local_a0,&local_68,&local_80);
    ParquetWriteSelect::anon_class_1_0_00000001::operator()
              (__return_storage_ptr__,(anon_class_1_0_00000001 *)&local_a0,ty);
    LogicalType::~LogicalType(&local_a0);
    LogicalType::~LogicalType(&local_80);
    LogicalType::~LogicalType(&local_68);
    pLVar1 = &local_d0;
    goto LAB_01ea8f86;
  default:
    ParquetWriteSelect::anon_class_1_0_00000001::operator()
              (__return_storage_ptr__,(anon_class_1_0_00000001 *)this,type);
    return __return_storage_ptr__;
  case (TypeVisitor)0x6b:
    UnionType::CopyMemberTypes_abi_cxx11_
              ((child_list_t<LogicalType> *)&local_b8,(UnionType *)this,type);
    pLVar1 = extraout_RDX_01;
    for (; (element_type *)local_b8._0_8_ !=
           local_b8.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_b8._0_8_ = local_b8._0_8_ + 0x38) {
      paVar2 = &(((element_type *)local_b8._0_8_)->alias).field_2;
      VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
                (&local_d0,(TypeVisitor *)paVar2->_M_local_buf,pLVar1,
                 (anon_class_1_0_00000001 *)func_00);
      LogicalType::operator=((LogicalType *)paVar2,&local_d0);
      LogicalType::~LogicalType(&local_d0);
      pLVar1 = extraout_RDX_02;
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_50,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_b8);
    LogicalType::UNION(&local_d0,&local_50);
    ParquetWriteSelect::anon_class_1_0_00000001::operator()
              (__return_storage_ptr__,(anon_class_1_0_00000001 *)&local_d0,ty_03);
    LogicalType::~LogicalType(&local_d0);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_50;
LAB_01ea9022:
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector(this_00);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_b8);
    return __return_storage_ptr__;
  case (TypeVisitor)0x6c:
    pLVar1 = ArrayType::GetChildType((LogicalType *)this);
    LogicalType::LogicalType(&local_b8,pLVar1);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__0&>
              (&local_a0,(TypeVisitor *)&local_b8,type_03,(anon_class_1_0_00000001 *)func_00);
    index = ArrayType::GetSize((LogicalType *)this);
    optional_idx::optional_idx(&local_88,index);
    LogicalType::ARRAY(&local_d0,&local_a0,local_88);
    ParquetWriteSelect::anon_class_1_0_00000001::operator()
              (__return_storage_ptr__,(anon_class_1_0_00000001 *)&local_d0,ty_01);
  }
  LogicalType::~LogicalType(&local_d0);
  pLVar1 = &local_a0;
LAB_01ea8f86:
  LogicalType::~LogicalType(pLVar1);
  LogicalType::~LogicalType(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

inline LogicalType TypeVisitor::VisitReplace(const LogicalType &type, F &&func) {
	switch (type.id()) {
	case LogicalTypeId::STRUCT: {
		auto children = StructType::GetChildTypes(type);
		for (auto &child : children) {
			child.second = VisitReplace(child.second, func);
		}
		return func(LogicalType::STRUCT(children));
	}
	case LogicalTypeId::UNION: {
		auto children = UnionType::CopyMemberTypes(type);
		for (auto &child : children) {
			child.second = VisitReplace(child.second, func);
		}
		return func(LogicalType::UNION(children));
	}
	case LogicalTypeId::LIST: {
		auto child = ListType::GetChildType(type);
		return func(LogicalType::LIST(VisitReplace(child, func)));
	}
	case LogicalTypeId::ARRAY: {
		auto child = ArrayType::GetChildType(type);
		return func(LogicalType::ARRAY(VisitReplace(child, func), ArrayType::GetSize(type)));
	}
	case LogicalTypeId::MAP: {
		auto key = MapType::KeyType(type);
		auto value = MapType::ValueType(type);
		return func(LogicalType::MAP(VisitReplace(key, func), VisitReplace(value, func)));
	}
	default:
		return func(type);
	}
}